

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O2

bool CRCCheck(uchar *Head,uchar *Message,int MessageLength,int pos)

{
  uint uVar1;
  uchar *ucBuffer;
  unsigned_long uVar2;
  int iVar3;
  ulong uVar4;
  uchar *puVar5;
  
  uVar4 = 0xffffffffffffffff;
  if (-0x1d < MessageLength) {
    uVar4 = (long)(MessageLength + 0x1c);
  }
  ucBuffer = (uchar *)operator_new__(uVar4);
  ucBuffer[0] = 0xaa;
  ucBuffer[1] = 'D';
  ucBuffer[2] = '\x12';
  iVar3 = -0x19;
  if (-0x19 < MessageLength) {
    iVar3 = MessageLength;
  }
  for (uVar4 = 0; iVar3 + 0x19 != uVar4; uVar4 = uVar4 + 1) {
    puVar5 = Message + -0x19;
    if (uVar4 < 0x19) {
      puVar5 = Head;
    }
    ucBuffer[uVar4 + 3] = puVar5[uVar4];
  }
  uVar2 = CalculateBlockCRC32((long)(MessageLength + 0x1c),ucBuffer);
  uVar1 = *(uint *)(Message + pos);
  operator_delete__(ucBuffer);
  return uVar2 == uVar1;
}

Assistant:

bool CRCCheck(unsigned char* Head, unsigned char* Message, int MessageLength, int pos)
{
    unsigned char* CRCtest = new unsigned char[MessageLength + 28];
    CRCtest[0] = 0xAA;
    CRCtest[1] = 0x44;
    CRCtest[2] = 0x12;
    for(int i = 0; i < MessageLength + 25; ++i)
    {
        if(i < 25)
            CRCtest[i + 3] = Head[i];
        else
            CRCtest[i + 3] = Message[i - 25];
    }
    unsigned long CRC_Calcu = CalculateBlockCRC32(MessageLength + 28, CRCtest);
    unsigned long CRC = U2L((Message) + pos, 4);
    delete [] CRCtest;

    if(CRC == CRC_Calcu)
        return true;
    else
        return false;
}